

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_helper.h
# Opt level: O0

void spdlog::details::fmt_helper::pad2(int n,memory_buf_t *dest)

{
  string_view fmt;
  buffer<char> *in_RSI;
  int in_EDI;
  basic_string_view<char> bVar1;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  anon_class_1_0_00000001 local_fa;
  undefined1 local_f9;
  char *local_f8;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *local_f0;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *local_e8;
  char local_da;
  char local_d9;
  buffer<char> *local_d8;
  anon_union_16_16_d721ec3a_for_value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_1
  local_cc;
  format_args in_stack_ffffffffffffff48;
  undefined8 uVar2;
  char *local_80;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *pbStack_78;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *local_70;
  undefined1 *local_60;
  char **local_58;
  char **local_50;
  char *local_48;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *pbStack_40;
  char *local_30;
  undefined1 *local_28;
  char *local_20;
  char *local_18;
  undefined8 local_10;
  undefined1 *local_8;
  
  if ((in_EDI < 0) || (99 < in_EDI)) {
    local_e8 = (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)
               std::back_inserter<fmt::v8::basic_memory_buffer<char,250ul,std::allocator<char>>>
                         (in_stack_fffffffffffffee8);
    pad2::anon_class_1_0_00000001::operator()(&local_fa);
    local_58 = &local_f8;
    local_60 = &local_f9;
    bVar1 = ::fmt::v8::operator()((FMT_COMPILE_STRING *)0x2c22a6);
    local_f0 = (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)bVar1.size_;
    local_f8 = bVar1.data_;
    ::fmt::v8::detail::check_format_string<int_&,_FMT_COMPILE_STRING,_0>();
    local_70 = local_e8;
    local_80 = local_f8;
    pbStack_78 = local_f0;
    local_50 = &local_80;
    local_48 = local_f8;
    pbStack_40 = local_f0;
    local_cc.int128_value._4_8_ =
         ::fmt::v8::make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,int&>
                   ((format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int> *
                    )&local_cc.string,(v8 *)in_RSI,(int *)local_e8);
    local_28 = &stack0xffffffffffffff50;
    local_30 = (char *)((long)&local_cc.string.data + 4);
    local_10 = 1;
    uVar2 = 1;
    fmt.size_ = (size_t)local_f8;
    fmt.data_ = local_30;
    local_20 = local_30;
    local_18 = local_30;
    local_8 = local_28;
    ::fmt::v8::
    vformat_to<std::back_insert_iterator<fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>_>,_0>
              ((back_insert_iterator<fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>_>
                )local_f0,fmt,in_stack_ffffffffffffff48);
  }
  else {
    local_d9 = (char)(in_EDI / 10) + '0';
    local_d8 = in_RSI;
    local_cc.int_value = in_EDI;
    ::fmt::v8::detail::buffer<char>::push_back(in_RSI,&local_d9);
    local_da = (char)(local_cc.int_value % 10) + '0';
    ::fmt::v8::detail::buffer<char>::push_back(local_d8,&local_da);
  }
  return;
}

Assistant:

inline void pad2(int n, memory_buf_t &dest)
{
    if (n >= 0 && n < 100) // 0-99
    {
        dest.push_back(static_cast<char>('0' + n / 10));
        dest.push_back(static_cast<char>('0' + n % 10));
    }
    else // unlikely, but just in case, let fmt deal with it
    {
        fmt_lib::format_to(std::back_inserter(dest), SPDLOG_FMT_STRING("{:02}"), n);
    }
}